

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_sequencetask.cc
# Opt level: O2

void ArgmaxTask::run(search *sch,multi_ex *ec)

{
  float *pfVar1;
  action aVar2;
  pointer ppeVar3;
  stringstream *psVar4;
  pointer ppeVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  float loss;
  uint local_38;
  uint32_t oracle;
  
  pfVar1 = (float *)sch->task_data;
  ppeVar3 = (ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  ppeVar5 = (ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  uVar8 = 1;
  for (lVar7 = 0; (long)ppeVar5 - (long)ppeVar3 >> 3 != lVar7; lVar7 = lVar7 + 1) {
    uVar6 = (ppeVar3[lVar7]->l).multi.label;
    if (uVar8 < uVar6) {
      uVar8 = uVar6;
    }
  }
  local_38 = 0;
  uVar6 = 1;
  while( true ) {
    if ((ulong)((long)ppeVar5 - (long)ppeVar3 >> 3) <= (ulong)local_38) break;
    oracle = uVar8;
    if (*(char *)(pfVar1 + 2) == '\0') {
      oracle = (ppeVar3[local_38]->l).multi.label;
    }
    aVar2 = Search::search::predict
                      (sch,ppeVar3[local_38],local_38 + 1,&oracle,1,&local_38,"p",(action *)0x0,0,
                       (float *)0x0,0,0.0);
    if (uVar6 < aVar2) {
      uVar6 = aVar2;
    }
    local_38 = local_38 + 1;
    ppeVar3 = (ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    ppeVar5 = (ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
              super__Vector_impl_data._M_finish;
  }
  if (uVar6 < uVar8) {
    loss = *pfVar1 / pfVar1[1];
  }
  else {
    loss = 0.0;
    if (uVar8 < uVar6) {
      loss = 1.0;
    }
  }
  Search::search::loss(sch,loss);
  psVar4 = Search::search::output_abi_cxx11_(sch);
  if (*(int *)(psVar4 + *(long *)(*(long *)psVar4 + -0x18) + 0x20) == 0) {
    psVar4 = Search::search::output_abi_cxx11_(sch);
    std::ostream::_M_insert<unsigned_long>((ulong)(psVar4 + 0x10));
  }
  return;
}

Assistant:

void run(Search::search& sch, multi_ex& ec)
{
  task_data& D = *sch.get_task_data<task_data>();
  uint32_t max_prediction = 1;
  uint32_t max_label = 1;

  for (size_t i = 0; i < ec.size(); i++) max_label = max(ec[i]->l.multi.label, max_label);

  for (ptag i = 0; i < ec.size(); i++)
  {
    // labels should be 1 or 2, and our output is MAX of all predicted values
    uint32_t oracle = D.predict_max ? max_label : ec[i]->l.multi.label;
    uint32_t prediction = sch.predict(*ec[i], i + 1, &oracle, 1, &i, "p");

    max_prediction = max(prediction, max_prediction);
  }
  float loss = 0.;
  if (max_label > max_prediction)
    loss = D.false_negative_cost / D.negative_weight;
  else if (max_prediction > max_label)
    loss = 1.;
  sch.loss(loss);

  if (sch.output().good())
    sch.output() << max_prediction;
}